

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O0

bool sf::priv::VulkanImplX11::createVulkanSurface
               (VkInstance *instance,WindowHandle windowHandle,VkSurfaceKHR *surface,
               VkAllocationCallbacks *allocator)

{
  bool bVar1;
  int iVar2;
  code *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  bool result;
  VkXlibSurfaceCreateInfoKHR surfaceCreateInfo;
  PFN_vkCreateXlibSurfaceKHR vkCreateXlibSurfaceKHR;
  VkInstance inst;
  undefined4 local_60 [4];
  Display *in_stack_ffffffffffffffb0;
  bool local_1;
  
  bVar1 = isAvailable(SUB81((ulong)in_RDI >> 0x30,0));
  if (bVar1) {
    pcVar3 = (code *)(*DAT_0049b4a8)(*in_RDI);
    if (pcVar3 == (code *)0x0) {
      local_1 = false;
    }
    else {
      memset(local_60,0,0x28);
      local_60[0] = 0x3b9ad9a0;
      OpenDisplay();
      iVar2 = (*pcVar3)(*in_RDI,local_60,in_RCX,in_RDX);
      local_1 = iVar2 == 0;
      CloseDisplay(in_stack_ffffffffffffffb0);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VulkanImplX11::createVulkanSurface(const VkInstance& instance, WindowHandle windowHandle, VkSurfaceKHR& surface, const VkAllocationCallbacks* allocator)
{
    if (!isAvailable())
        return false;

    // Make a copy of the instance handle since we get it passed as a reference
    VkInstance inst = instance;

    PFN_vkCreateXlibSurfaceKHR vkCreateXlibSurfaceKHR = reinterpret_cast<PFN_vkCreateXlibSurfaceKHR>(wrapper.vkGetInstanceProcAddr(inst, "vkCreateXlibSurfaceKHR"));

    if (!vkCreateXlibSurfaceKHR)
        return false;

    // Since the surface is basically attached to the window, the connection
    // to the X display will stay open even after we open and close it here
    VkXlibSurfaceCreateInfoKHR surfaceCreateInfo = VkXlibSurfaceCreateInfoKHR();
    surfaceCreateInfo.sType = VK_STRUCTURE_TYPE_XLIB_SURFACE_CREATE_INFO_KHR;
    surfaceCreateInfo.dpy = OpenDisplay();
    surfaceCreateInfo.window = windowHandle;

    bool result = (vkCreateXlibSurfaceKHR(instance, &surfaceCreateInfo, allocator, &surface) == VK_SUCCESS);

    CloseDisplay(surfaceCreateInfo.dpy);

    return result;
}